

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

Vec_Int_t * Gla_ManRefinement2(Gla_Man_t *p)

{
  Rfn_Obj_t RVar1;
  Rfn_Obj_t RVar2;
  Gia_Man_t *pGVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *vCos_00;
  Vec_Int_t *vPis_00;
  Vec_Int_t *vPPis_00;
  Vec_Int_t *vRoAnds_00;
  Gia_Obj_t *pGVar8;
  Rfn_Obj_t *pRVar9;
  Rfn_Obj_t *pRVar10;
  Rfn_Obj_t *pRVar11;
  Abc_Cex_t *pAVar12;
  bool bVar13;
  int local_70;
  int local_6c;
  int f;
  int i;
  Gia_Obj_t *pObj;
  Rfn_Obj_t *pRef1;
  Rfn_Obj_t *pRef0;
  Rfn_Obj_t *pRef;
  Vec_Int_t *vSelect;
  Vec_Int_t *vRoAnds;
  Vec_Int_t *vCos;
  Vec_Int_t *vPPis;
  Vec_Int_t *vPis;
  int fVerify;
  Gla_Man_t *p_local;
  
  Gla_ManRefinement2::Sign = Gla_ManRefinement2::Sign + 1;
  vCos_00 = Vec_IntAlloc(1000);
  vPis_00 = Vec_IntAlloc(1000);
  vPPis_00 = Vec_IntAlloc(1000);
  vRoAnds_00 = Vec_IntAlloc(1000);
  Gla_ManCollect(p,vPis_00,vPPis_00,vCos_00,vRoAnds_00);
  local_70 = 0;
  do {
    if (p->pPars->iFrame < local_70) {
      _f = Gia_ManPo(p->pGia,0);
      pRVar9 = Gla_ObjRef(p,_f,p->pPars->iFrame);
      if (((uint)*pRVar9 & 1) != 1) {
        Abc_Print(1,"\nCounter-example verification has failed!!!\n");
      }
      if (((uint)*pRVar9 >> 3 & 0xffff) == 0) {
        pAVar12 = Gla_ManDeriveCex(p,vPis_00);
        p->pGia->pCexSeq = pAVar12;
        Vec_IntFree(vPis_00);
        Vec_IntFree(vPPis_00);
        Vec_IntFree(vRoAnds_00);
        Vec_IntFree(vCos_00);
        p_local = (Gla_Man_t *)0x0;
      }
      else {
        p_local = (Gla_Man_t *)Vec_IntAlloc(100);
        Vec_IntFill(p->vObjCounts,p->pPars->iFrame + 1,0);
        pGVar8 = Gia_ManPo(p->pGia,0);
        pGVar8 = Gia_ObjFanin0(pGVar8);
        Gla_ManRefSelect_rec
                  (p,pGVar8,p->pPars->iFrame,(Vec_Int_t *)p_local,Gla_ManRefinement2::Sign);
        Vec_IntUniqify((Vec_Int_t *)p_local);
        Gla_ManVerifyUsingTerSim(p,vPis_00,vPPis_00,vRoAnds_00,vCos_00,(Vec_Int_t *)p_local);
        local_6c = 0;
        while( true ) {
          iVar5 = Vec_IntSize((Vec_Int_t *)p_local);
          bVar13 = false;
          if (local_6c < iVar5) {
            pGVar3 = p->pGia;
            iVar5 = Vec_IntEntry((Vec_Int_t *)p_local,local_6c);
            _f = Gia_ManObj(pGVar3,iVar5);
            bVar13 = _f != (Gia_Obj_t *)0x0;
          }
          if (!bVar13) break;
          puVar4 = p->pObj2Obj;
          iVar5 = Gia_ObjId(p->pGia,_f);
          Vec_IntWriteEntry((Vec_Int_t *)p_local,local_6c,puVar4[iVar5]);
          local_6c = local_6c + 1;
        }
        Vec_IntFree(vPis_00);
        Vec_IntFree(vPPis_00);
        Vec_IntFree(vRoAnds_00);
        Vec_IntFree(vCos_00);
        iVar5 = Vec_IntSize((Vec_Int_t *)p_local);
        p->nObjAdded = iVar5 + p->nObjAdded;
      }
      return (Vec_Int_t *)p_local;
    }
    pGVar8 = Gia_ManConst0(p->pGia);
    pRVar9 = Gla_ObjRef(p,pGVar8,local_70);
    Gla_ObjClearRef(pRVar9);
    *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfffffffe);
    *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfff80007);
    *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0x8007ffff | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13);
    local_6c = 0;
    while( true ) {
      iVar5 = Vec_IntSize(vPis_00);
      bVar13 = false;
      if (local_6c < iVar5) {
        pGVar3 = p->pGia;
        iVar5 = Vec_IntEntry(vPis_00,local_6c);
        _f = Gia_ManObj(pGVar3,iVar5);
        bVar13 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar13) break;
      pRVar9 = Gla_ObjRef(p,_f,local_70);
      Gla_ObjClearRef(pRVar9);
      iVar5 = Gia_ObjId(p->pGia,_f);
      uVar7 = Gla_ObjSatValue(p,iVar5,local_70);
      *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfffffffe | uVar7 & 1);
      *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfff80007);
      *pRVar9 = (Rfn_Obj_t)
                ((uint)*pRVar9 & 0x8007ffff | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13);
      if (((uint)*pRVar9 >> 1 & 1) != 0) {
        __assert_fail("pRef->fVisit == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x24b,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
      }
      local_6c = local_6c + 1;
    }
    local_6c = 0;
    while( true ) {
      iVar5 = Vec_IntSize(vPPis_00);
      bVar13 = false;
      if (local_6c < iVar5) {
        pGVar3 = p->pGia;
        iVar5 = Vec_IntEntry(vPPis_00,local_6c);
        _f = Gia_ManObj(pGVar3,iVar5);
        bVar13 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar13) break;
      iVar5 = Gia_ObjIsAnd(_f);
      if ((iVar5 == 0) && (iVar5 = Gia_ObjIsRo(p->pGia,_f), iVar5 == 0)) {
        __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x251,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
      }
      pRVar9 = Gla_ObjRef(p,_f,local_70);
      Gla_ObjClearRef(pRVar9);
      iVar5 = Gia_ObjId(p->pGia,_f);
      uVar7 = Gla_ObjSatValue(p,iVar5,local_70);
      *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfffffffe | uVar7 & 1);
      *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfff80007 | (local_6c + 1U & 0xffff) << 3);
      *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfffffffb | 4);
      *pRVar9 = (Rfn_Obj_t)
                ((uint)*pRVar9 & 0x8007ffff | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13);
      if (((uint)*pRVar9 >> 1 & 1) != 0) {
        __assert_fail("pRef->fVisit == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,599,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
      }
      local_6c = local_6c + 1;
    }
    local_6c = 0;
    while( true ) {
      iVar5 = Vec_IntSize(vRoAnds_00);
      bVar13 = false;
      if (local_6c < iVar5) {
        pGVar3 = p->pGia;
        iVar5 = Vec_IntEntry(vRoAnds_00,local_6c);
        _f = Gia_ManObj(pGVar3,iVar5);
        bVar13 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar13) break;
      iVar5 = Gia_ObjIsAnd(_f);
      if ((iVar5 == 0) && (iVar5 = Gia_ObjIsRo(p->pGia,_f), iVar5 == 0)) {
        __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x25c,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
      }
      pRVar9 = Gla_ObjRef(p,_f,local_70);
      Gla_ObjClearRef(pRVar9);
      iVar5 = Gia_ObjIsRo(p->pGia,_f);
      if (iVar5 == 0) {
        iVar5 = Gia_ObjIsAnd(_f);
        if (iVar5 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x26f,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
        }
        pGVar8 = Gia_ObjFanin0(_f);
        pRVar11 = Gla_ObjRef(p,pGVar8,local_70);
        pGVar8 = Gia_ObjFanin1(_f);
        pRVar10 = Gla_ObjRef(p,pGVar8,local_70);
        RVar2 = *pRVar11;
        uVar7 = Gia_ObjFaninC0(_f);
        RVar1 = *pRVar10;
        uVar6 = Gia_ObjFaninC1(_f);
        *pRVar9 = (Rfn_Obj_t)
                  ((uint)*pRVar9 & 0xfffffffe |
                  ((uint)RVar2 & 1 ^ uVar7) & ((uint)RVar1 & 1 ^ uVar6) & 1);
        puVar4 = p->pObj2Obj;
        iVar5 = Gia_ObjId(p->pGia,_f);
        if (puVar4[iVar5] != 0xffffffff) {
          puVar4 = p->pObj2Obj;
          iVar5 = Gia_ObjId(p->pGia,_f);
          iVar5 = Gla_ManCheckVar(p,puVar4[iVar5],local_70);
          if (iVar5 != 0) {
            RVar2 = *pRVar9;
            iVar5 = Gia_ObjId(p->pGia,_f);
            uVar7 = Gla_ObjSatValue(p,iVar5,local_70);
            if (((uint)RVar2 & 1) != uVar7) {
              Abc_Print(1,"Object has value mismatch    ");
              Gia_ObjPrint(p->pGia,_f);
            }
          }
        }
        if (((uint)*pRVar9 & 1) == 1) {
          uVar7 = Abc_MaxInt((uint)*pRVar11 >> 3 & 0xffff,(uint)*pRVar10 >> 3 & 0xffff);
          *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfff80007 | (uVar7 & 0xffff) << 3);
        }
        else {
          RVar2 = *pRVar11;
          uVar7 = Gia_ObjFaninC0(_f);
          if ((((uint)RVar2 & 1) == uVar7) &&
             (RVar2 = *pRVar10, uVar7 = Gia_ObjFaninC1(_f), ((uint)RVar2 & 1) == uVar7)) {
            uVar7 = Abc_MinInt((uint)*pRVar11 >> 3 & 0xffff,(uint)*pRVar10 >> 3 & 0xffff);
            *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfff80007 | (uVar7 & 0xffff) << 3);
          }
          else {
            RVar2 = *pRVar11;
            uVar7 = Gia_ObjFaninC0(_f);
            if (((uint)RVar2 & 1) == uVar7) {
              *pRVar9 = (Rfn_Obj_t)
                        ((uint)*pRVar9 & 0xfff80007 | ((uint)*pRVar11 >> 3 & 0xffff) << 3);
            }
            else {
              *pRVar9 = (Rfn_Obj_t)
                        ((uint)*pRVar9 & 0xfff80007 | ((uint)*pRVar10 >> 3 & 0xffff) << 3);
            }
          }
        }
        if (((uint)*pRVar9 >> 1 & 1) != 0) {
          __assert_fail("pRef->fVisit == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x284,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
        }
        *pRVar9 = (Rfn_Obj_t)
                  ((uint)*pRVar9 & 0x8007ffff | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13);
      }
      else if (local_70 == 0) {
        *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfffffffe);
        *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfff80007);
        *pRVar9 = (Rfn_Obj_t)
                  ((uint)*pRVar9 & 0x8007ffff | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13);
      }
      else {
        pGVar8 = Gia_ObjRoToRi(p->pGia,_f);
        pRVar11 = Gla_ObjRef(p,pGVar8,local_70 + -1);
        *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfffffffe | (uint)*pRVar11 & 1);
        *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfff80007 | ((uint)*pRVar11 >> 3 & 0xffff) << 3);
        *pRVar9 = (Rfn_Obj_t)
                  ((uint)*pRVar9 & 0x8007ffff | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13);
      }
      local_6c = local_6c + 1;
    }
    local_6c = 0;
    while( true ) {
      iVar5 = Vec_IntSize(vCos_00);
      bVar13 = false;
      if (local_6c < iVar5) {
        pGVar3 = p->pGia;
        iVar5 = Vec_IntEntry(vCos_00,local_6c);
        _f = Gia_ManObj(pGVar3,iVar5);
        bVar13 = _f != (Gia_Obj_t *)0x0;
      }
      if (!bVar13) break;
      pRVar9 = Gla_ObjRef(p,_f,local_70);
      Gla_ObjClearRef(pRVar9);
      pGVar8 = Gia_ObjFanin0(_f);
      pRVar11 = Gla_ObjRef(p,pGVar8,local_70);
      RVar2 = *pRVar11;
      uVar7 = Gia_ObjFaninC0(_f);
      *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfffffffe | ((uint)RVar2 & 1 ^ uVar7) & 1);
      *pRVar9 = (Rfn_Obj_t)((uint)*pRVar9 & 0xfff80007 | ((uint)*pRVar11 >> 3 & 0xffff) << 3);
      if (((uint)*pRVar9 >> 1 & 1) != 0) {
        __assert_fail("pRef->fVisit == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x28e,"Vec_Int_t *Gla_ManRefinement2(Gla_Man_t *)");
      }
      *pRVar9 = (Rfn_Obj_t)
                ((uint)*pRVar9 & 0x8007ffff | (Gla_ManRefinement2::Sign & 0xfffU) << 0x13);
      local_6c = local_6c + 1;
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gla_ManRefinement2( Gla_Man_t * p )
{
    int fVerify = 1;
    static int Sign = 0;
    Vec_Int_t * vPis, * vPPis, * vCos, * vRoAnds, * vSelect = NULL;
    Rfn_Obj_t * pRef, * pRef0, * pRef1;
    Gia_Obj_t * pObj;
    int i, f;
    Sign++;

    // compute PIs and pseudo-PIs
    vCos = Vec_IntAlloc( 1000 );
    vPis = Vec_IntAlloc( 1000 );  
    vPPis = Vec_IntAlloc( 1000 );
    vRoAnds = Vec_IntAlloc( 1000 );  
    Gla_ManCollect( p, vPis, vPPis, vCos, vRoAnds );

/*
    // check how many pseudo PIs have variables
    Gla_ManForEachObjAbsVec( vPis, p, pGla, i )
    {
        Abc_Print( 1, "  %5d : ", Gla_ObjId(p, pGla) );
        for ( f = 0; f <= p->pPars->iFrame; f++ )
            Abc_Print( 1, "%d", Gla_ManCheckVar(p, Gla_ObjId(p, pGla), f) );
        Abc_Print( 1, "\n" );
    }    

    // check how many pseudo PIs have variables
    Gla_ManForEachObjAbsVec( vPPis, p, pGla, i )
    {
        Abc_Print( 1, "%5d : ", Gla_ObjId(p, pGla) );
        for ( f = 0; f <= p->pPars->iFrame; f++ )
            Abc_Print( 1, "%d", Gla_ManCheckVar(p, Gla_ObjId(p, pGla), f) );
        Abc_Print( 1, "\n" );
    }    
*/
    // propagate values
    for ( f = 0; f <= p->pPars->iFrame; f++ )
    {
        // constant
        pRef = Gla_ObjRef( p, Gia_ManConst0(p->pGia), f );  Gla_ObjClearRef( pRef );
        pRef->Value  = 0;
        pRef->Prio   = 0;
        pRef->Sign   = Sign;
        // primary input
        Gia_ManForEachObjVec( vPis, p->pGia, pObj, i )
        {
//            assert( f == p->pPars->iFrame || Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            pRef->Value = Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f );
            pRef->Prio  = 0;
            pRef->Sign  = Sign;
            assert( pRef->fVisit == 0 );
        }
        // primary input
        Gia_ManForEachObjVec( vPPis, p->pGia, pObj, i )
        {
//            assert( f == p->pPars->iFrame || Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) );
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            pRef->Value = Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f );
            pRef->Prio  = i+1;
            pRef->fPPi  = 1;
            pRef->Sign  = Sign;
            assert( pRef->fVisit == 0 );
        }
        // internal nodes
        Gia_ManForEachObjVec( vRoAnds, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
            pRef = Gla_ObjRef( p, pObj, f );   Gla_ObjClearRef( pRef );
            if ( Gia_ObjIsRo(p->pGia, pObj) )
            {
                if ( f == 0 )
                {
                    pRef->Value = 0;
                    pRef->Prio  = 0;
                    pRef->Sign  = Sign;
                }
                else
                {
                    pRef0 = Gla_ObjRef( p, Gia_ObjRoToRi(p->pGia, pObj), f-1 );
                    pRef->Value = pRef0->Value;
                    pRef->Prio  = pRef0->Prio;
                    pRef->Sign  = Sign;
                }
                continue;
            }
            assert( Gia_ObjIsAnd(pObj) );
            pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f );
            pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pObj), f );
            pRef->Value = (pRef0->Value ^ Gia_ObjFaninC0(pObj)) & (pRef1->Value ^ Gia_ObjFaninC1(pObj));

            if ( p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] != ~0 && 
                 Gla_ManCheckVar(p, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)], f) &&
                 (int)pRef->Value != Gla_ObjSatValue(p, Gia_ObjId(p->pGia, pObj), f) )
            {
                    Abc_Print( 1, "Object has value mismatch    " );
                    Gia_ObjPrint( p->pGia, pObj );
            }

            if ( pRef->Value == 1 )
                pRef->Prio  = Abc_MaxInt( pRef0->Prio, pRef1->Prio );
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
                pRef->Prio  = Abc_MinInt( pRef0->Prio, pRef1->Prio ); // choice
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
                pRef->Prio  = pRef0->Prio;
            else 
                pRef->Prio  = pRef1->Prio;
            assert( pRef->fVisit == 0 );
            pRef->Sign  = Sign;
        }
        // output nodes
        Gia_ManForEachObjVec( vCos, p->pGia, pObj, i )
        {
            pRef = Gla_ObjRef( p, pObj, f );    Gla_ObjClearRef( pRef );
            pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f ); 
            pRef->Value = (pRef0->Value ^ Gia_ObjFaninC0(pObj));
            pRef->Prio  = pRef0->Prio;
            assert( pRef->fVisit == 0 );
            pRef->Sign  = Sign;
        }
    } 

    // make sure the output value is 1
    pObj = Gia_ManPo( p->pGia, 0 );
    pRef = Gla_ObjRef( p, pObj, p->pPars->iFrame );
    if ( pRef->Value != 1 )
        Abc_Print( 1, "\nCounter-example verification has failed!!!\n" );

    // check the CEX
    if ( pRef->Prio == 0 )
    {
        p->pGia->pCexSeq = Gla_ManDeriveCex( p, vPis );
        Vec_IntFree( vPis );
        Vec_IntFree( vPPis );
        Vec_IntFree( vRoAnds );
        Vec_IntFree( vCos );
        return NULL;
    }

    // select objects
    vSelect = Vec_IntAlloc( 100 );
    Vec_IntFill( p->vObjCounts, p->pPars->iFrame+1, 0 );
    Gla_ManRefSelect_rec( p, Gia_ObjFanin0(Gia_ManPo(p->pGia, 0)), p->pPars->iFrame, vSelect, Sign );
    Vec_IntUniqify( vSelect );

/*
    for ( f = 0; f < p->pPars->iFrame; f++ )
        printf( "%2d", Vec_IntEntry(p->vObjCounts, f) );
    printf( "\n" );
*/
    if ( fVerify )
        Gla_ManVerifyUsingTerSim( p, vPis, vPPis, vRoAnds, vCos, vSelect );

    // remap them into GLA objects
    Gia_ManForEachObjVec( vSelect, p->pGia, pObj, i )
        Vec_IntWriteEntry( vSelect, i, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] );

    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Vec_IntFree( vRoAnds );
    Vec_IntFree( vCos );

    p->nObjAdded += Vec_IntSize(vSelect);
    return vSelect;
}